

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_set_screen_window_width(exr_context_t ctxt,int part_index,float ssw)

{
  long lVar1;
  long lVar2;
  exr_result_t eVar3;
  int iVar4;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar5;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar2 = *(long *)(lVar1 + 0x58);
      if (lVar2 == 0) {
        iVar4 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"screenWindowWidth",
                                  EXR_ATTR_FLOAT,0,(uint8_t **)0x0,
                                  (exr_attribute_t **)(lVar1 + 0x58));
      }
      else {
        iVar4 = 0;
        if (*(int *)(lVar2 + 0x14) != 8) {
          eVar3 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(lVar2 + 8),"screenWindowWidth",*(code **)(ctxt + 0x48))
          ;
          return eVar3;
        }
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      ((*(exr_attribute_t **)(lVar1 + 0x58))->field_6).f = ssw;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 8;
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar5);
  return eVar3;
}

Assistant:

exr_result_t
exr_set_screen_window_width (exr_context_t ctxt, int part_index, float ssw)
{
    REQ_ATTR_FIND_CREATE (screenWindowWidth, EXR_ATTR_FLOAT);
    if (rv == EXR_ERR_SUCCESS) attr->f = ssw;
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}